

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minja.hpp
# Opt level: O2

void __thiscall
minja::FilterNode::do_render
          (FilterNode *this,ostringstream *out,shared_ptr<minja::Context> *context)

{
  Expression *this_00;
  runtime_error *prVar1;
  initializer_list<minja::Value> __l;
  string sStack_138;
  ArgumentsValue local_118;
  Value result;
  string rendered_body;
  Value filter_value;
  
  this_00 = (this->filter).super___shared_ptr<minja::Expression,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  if (this_00 == (Expression *)0x0) {
    prVar1 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(prVar1,"FilterNode.filter is null");
  }
  else {
    if ((this->body).super___shared_ptr<minja::TemplateNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
        (element_type *)0x0) {
      Expression::evaluate(&filter_value,this_00,context);
      if (filter_value.callable_.
          super___shared_ptr<std::function<minja::Value_(const_std::shared_ptr<minja::Context>_&,_minja::ArgumentsValue_&)>,_(__gnu_cxx::_Lock_policy)2>
          ._M_ptr != (element_type *)0x0) {
        TemplateNode::render_abi_cxx11_
                  (&rendered_body,
                   (this->body).super___shared_ptr<minja::TemplateNode,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr,context);
        Value::Value(&result,&rendered_body);
        __l._M_len = 1;
        __l._M_array = &result;
        std::vector<minja::Value,_std::allocator<minja::Value>_>::vector
                  (&local_118.args,__l,(allocator_type *)&sStack_138);
        local_118.kwargs.
        super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_minja::Value>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_minja::Value>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        local_118.kwargs.
        super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_minja::Value>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_minja::Value>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        local_118.kwargs.
        super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_minja::Value>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_minja::Value>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        Value::~Value(&result);
        Value::call(&result,&filter_value,context,&local_118);
        Value::to_str_abi_cxx11_(&sStack_138,&result);
        std::operator<<((ostream *)out,(string *)&sStack_138);
        std::__cxx11::string::~string((string *)&sStack_138);
        Value::~Value(&result);
        ArgumentsValue::~ArgumentsValue(&local_118);
        std::__cxx11::string::~string((string *)&rendered_body);
        Value::~Value(&filter_value);
        return;
      }
      prVar1 = (runtime_error *)__cxa_allocate_exception(0x10);
      Value::dump_abi_cxx11_((string *)&local_118,&filter_value,-1,false);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&result,
                     "Filter must be a callable: ",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_118
                    );
      std::runtime_error::runtime_error(prVar1,(string *)&result);
      __cxa_throw(prVar1,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    prVar1 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(prVar1,"FilterNode.body is null");
  }
  __cxa_throw(prVar1,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void do_render(std::ostringstream & out, const std::shared_ptr<Context> & context) const override {
        if (!filter) throw std::runtime_error("FilterNode.filter is null");
        if (!body) throw std::runtime_error("FilterNode.body is null");
        auto filter_value = filter->evaluate(context);
        if (!filter_value.is_callable()) {
            throw std::runtime_error("Filter must be a callable: " + filter_value.dump());
        }
        std::string rendered_body = body->render(context);

        ArgumentsValue filter_args = {{Value(rendered_body)}, {}};
        auto result = filter_value.call(context, filter_args);
        out << result.to_str();
    }